

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_long,unsigned_long>
          (Thread *this,BinopFunc<unsigned_long,_unsigned_long> *f)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  Simd<unsigned_long,_(unsigned_char)__x02_> SVar3;
  byte local_41;
  unsigned_long uStack_40;
  u8 i;
  SR result;
  Simd<unsigned_long,_(unsigned_char)__x02_> lhs;
  unsigned_long amount;
  BinopFunc<unsigned_long,_unsigned_long> *f_local;
  Thread *this_local;
  
  uVar1 = Pop<unsigned_long>(this);
  SVar3 = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  result.v[1] = SVar3.v[0];
  lhs.v[0] = SVar3.v[1];
  for (local_41 = 0; local_41 < 2; local_41 = local_41 + 1) {
    uVar2 = (*f)(result.v[(ulong)local_41 + 1],uVar1);
    lhs.v[(ulong)local_41 - 3] = uVar2;
  }
  SVar3.v[1] = result.v[0];
  SVar3.v[0] = uStack_40;
  Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,SVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<T>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}